

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O2

vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *
__thiscall
IncrementalEditDistance::all_next
          (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
           *__return_storage_ptr__,IncrementalEditDistance *this)

{
  action aVar1;
  pair<unsigned_int,_float> in_RAX;
  long lVar2;
  size_t n;
  ulong uVar3;
  float fVar4;
  float fVar5;
  pair<unsigned_int,_float> local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28 = in_RAX;
  for (lVar2 = -0x1d; lVar2 != 0; lVar2 = lVar2 + 1) {
    local_28.second = 1.0;
    local_28.first = (int)lVar2 + 0x1e;
    std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>::
    emplace_back<std::pair<unsigned_int,float>>
              ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                *)__return_storage_ptr__,&local_28);
  }
  fVar4 = (float)(this->prev_row[this->N] - this->prev_row_min);
  fVar5 = 100.0;
  if (fVar4 <= 100.0) {
    fVar5 = fVar4;
  }
  ((__return_storage_ptr__->
   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
   )._M_impl.super__Vector_impl_data._M_start)->second = fVar5;
  for (uVar3 = 0; uVar3 < this->N; uVar3 = uVar3 + 1) {
    if (this->prev_row[uVar3] == this->prev_row_min) {
      aVar1 = char2action((this->target)._M_dataplus._M_p[uVar3]);
      (__return_storage_ptr__->
      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      )._M_impl.super__Vector_impl_data._M_start[(ulong)aVar1 - 1].second = 0.0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector< pair<action,float> > all_next()
  { vector< pair<action,float> > B;
    for (size_t a=1; a<=29; a++)
      B.push_back( make_pair(a, 1.) );
    B[ char2action('$')-1 ].second = minf(100., (float)(prev_row[N] - prev_row_min));
    for (size_t n=0; n<N; n++)
      if (prev_row[n] == prev_row_min)
        B[ char2action(target[n])-1 ].second = 0.;
    return B;
  }